

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::SolveDirect
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B,DecomposeType dt)

{
  int in_EDX;
  TPZFMatrix<Fad<double>_> *in_RSI;
  TPZMatrix<Fad<double>_> *in_RDI;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  int local_4;
  
  if (in_EDX == 1) {
    local_4 = Solve_LU(in_RDI,in_RSI);
  }
  else if (in_EDX == 3) {
    local_4 = (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x42])
                        (in_RDI,in_RSI);
  }
  else if (in_EDX == 4) {
    local_4 = Solve_LDLt(in_RDI,in_RSI);
  }
  else {
    Error(in_stack_000001e0,in_stack_000001d8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt) {
	
	switch ( dt ) {
		case ELU:
			return( Solve_LU( &B)  );
		case ECholesky:
			return( Solve_Cholesky( &B )  );
		case ELDLt:
			return( Solve_LDLt( &B )  );
		default:
			Error( "Solve  < Unknown decomposition type >" );
			break;
	}
	return ( 0 );
}